

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_socket(connectdata *conn,Curl_addrinfo *ai,Curl_sockaddr_ex *addr,
                    curl_socket_t *sockfd)

{
  int __type;
  SessionHandle *pSVar1;
  curl_opensocket_callback p_Var2;
  uint uVar3;
  int iVar4;
  CURLcode CVar5;
  Curl_sockaddr_ex *pCVar6;
  int __protocol;
  Curl_sockaddr_ex *pCVar7;
  Curl_sockaddr_ex dummy;
  Curl_sockaddr_ex local_c0;
  
  pSVar1 = conn->data;
  pCVar7 = addr;
  if (addr == (Curl_sockaddr_ex *)0x0) {
    pCVar7 = &local_c0;
  }
  iVar4 = ai->ai_family;
  pCVar7->family = iVar4;
  __type = conn->socktype;
  pCVar7->socktype = __type;
  __protocol = 0x11;
  if (__type != 2) {
    __protocol = ai->ai_protocol;
  }
  pCVar6 = &local_c0;
  if (addr != (Curl_sockaddr_ex *)0x0) {
    pCVar6 = addr;
  }
  pCVar6->protocol = __protocol;
  uVar3 = 0x80;
  if (ai->ai_addrlen < 0x80) {
    uVar3 = ai->ai_addrlen;
  }
  pCVar6->addrlen = uVar3;
  memcpy(&pCVar6->_sa_ex_u,ai->ai_addr,(ulong)uVar3);
  p_Var2 = (pSVar1->set).fopensocket;
  if (p_Var2 == (curl_opensocket_callback)0x0) {
    iVar4 = socket(iVar4,__type,__protocol);
  }
  else {
    iVar4 = (*p_Var2)((pSVar1->set).opensocket_client,CURLSOCKTYPE_IPCXN,(curl_sockaddr *)pCVar7);
  }
  *sockfd = iVar4;
  CVar5 = CURLE_COULDNT_CONNECT;
  if (iVar4 != -1) {
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_socket(struct connectdata *conn,
                     const Curl_addrinfo *ai,
                     struct Curl_sockaddr_ex *addr,
                     curl_socket_t *sockfd)
{
  struct SessionHandle *data = conn->data;
  struct Curl_sockaddr_ex dummy;

  if(!addr)
    /* if the caller doesn't want info back, use a local temp copy */
    addr = &dummy;

  /*
   * The Curl_sockaddr_ex structure is basically libcurl's external API
   * curl_sockaddr structure with enough space available to directly hold
   * any protocol-specific address structures. The variable declared here
   * will be used to pass / receive data to/from the fopensocket callback
   * if this has been set, before that, it is initialized from parameters.
   */

  addr->family = ai->ai_family;
  addr->socktype = conn->socktype;
  addr->protocol = conn->socktype==SOCK_DGRAM?IPPROTO_UDP:ai->ai_protocol;
  addr->addrlen = ai->ai_addrlen;

  if(addr->addrlen > sizeof(struct Curl_sockaddr_storage))
     addr->addrlen = sizeof(struct Curl_sockaddr_storage);
  memcpy(&addr->sa_addr, ai->ai_addr, addr->addrlen);

  if(data->set.fopensocket)
   /*
    * If the opensocket callback is set, all the destination address
    * information is passed to the callback. Depending on this information the
    * callback may opt to abort the connection, this is indicated returning
    * CURL_SOCKET_BAD; otherwise it will return a not-connected socket. When
    * the callback returns a valid socket the destination address information
    * might have been changed and this 'new' address will actually be used
    * here to connect.
    */
    *sockfd = data->set.fopensocket(data->set.opensocket_client,
                                    CURLSOCKTYPE_IPCXN,
                                    (struct curl_sockaddr *)addr);
  else
    /* opensocket callback not set, so simply create the socket now */
    *sockfd = socket(addr->family, addr->socktype, addr->protocol);

  if(*sockfd == CURL_SOCKET_BAD)
    /* no socket, no connection */
    return CURLE_COULDNT_CONNECT;

#if defined(ENABLE_IPV6) && defined(HAVE_SOCKADDR_IN6_SIN6_SCOPE_ID)
  if(conn->scope && (addr->family == AF_INET6)) {
    struct sockaddr_in6 * const sa6 = (void *)&addr->sa_addr;
    sa6->sin6_scope_id = conn->scope;
  }
#endif

  return CURLE_OK;

}